

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::NotImplementedException::NotImplementedException<unsigned_int,char_const*>
          (NotImplementedException *this,string *msg,uint params,char *params_1)

{
  undefined4 in_register_00000014;
  char *in_R8;
  string local_30;
  
  Exception::ConstructMessage<unsigned_int,char_const*>
            (&local_30,(Exception *)msg,(string *)CONCAT44(in_register_00000014,params),
             (uint)params_1,in_R8);
  Exception::Exception(&this->super_Exception,NOT_IMPLEMENTED,&local_30);
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_02497ee8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit NotImplementedException(const string &msg, ARGS... params)
	    : NotImplementedException(ConstructMessage(msg, params...)) {
	}